

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> __thiscall
duckdb::ClientContext::TableInfo(ClientContext *this,string *schema_name,string *table_name)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,anon_var_dwarf_4f470fa + 9);
  TableInfo(this,schema_name,&local_50,table_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
         (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)this;
}

Assistant:

unique_ptr<TableDescription> ClientContext::TableInfo(const string &schema_name, const string &table_name) {
	return TableInfo(INVALID_CATALOG, schema_name, table_name);
}